

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluator.cxx
# Opt level: O0

string * __thiscall
GeneratorExpressionContent::EvaluateParameters
          (string *__return_storage_ptr__,GeneratorExpressionContent *this,
          cmGeneratorExpressionNode *node,string *identifier,cmGeneratorExpressionContext *context,
          cmGeneratorExpressionDAGChecker *dagChecker,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  pointer pvVar4;
  reference ppcVar5;
  size_type sVar6;
  ostream *poVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  string local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  undefined1 local_320 [8];
  ostringstream e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  int local_e4;
  string local_e0 [32];
  __normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
  local_c0;
  const_iterator end;
  const_iterator it;
  string parameter;
  undefined1 local_78 [8];
  string lastParam;
  int counter;
  bool acceptsArbitraryContent;
  const_iterator pend;
  const_iterator pit;
  int numExpected;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  cmGeneratorExpressionContext *context_local;
  string *identifier_local;
  cmGeneratorExpressionNode *node_local;
  GeneratorExpressionContent *this_local;
  
  uVar2 = (*node->_vptr_cmGeneratorExpressionNode[5])();
  pend = std::
         vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
         ::begin(&this->ParamChildren);
  _counter = std::
             vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
             ::end(&this->ParamChildren);
  iVar3 = (*node->_vptr_cmGeneratorExpressionNode[4])();
  lastParam.field_2._M_local_buf[0xf] = (byte)iVar3 & 1;
  lastParam.field_2._8_4_ = 1;
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&pend,(__normal_iterator<const_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_*,_std::vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>_>
                              *)&counter);
    if (!bVar1) {
      if (((int)uVar2 < 1) ||
         (sVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(parameters), uVar2 == sVar6)) {
        if ((uVar2 == 0xffffffff) &&
           (bVar1 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty(parameters), bVar1)) {
          GetOriginalExpression_abi_cxx11_(&local_3c0,this);
          std::operator+(&local_400,"$<",identifier);
          std::operator+(&local_3e0,&local_400,"> expression requires at least one parameter.");
          reportError(context,&local_3c0,&local_3e0);
          std::__cxx11::string::~string((string *)&local_3e0);
          std::__cxx11::string::~string((string *)&local_400);
          std::__cxx11::string::~string((string *)&local_3c0);
        }
        if ((uVar2 == 0xfffffffe) &&
           (sVar6 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(parameters), 1 < sVar6)) {
          GetOriginalExpression_abi_cxx11_(&local_420,this);
          std::operator+(&local_460,"$<",identifier);
          std::operator+(&local_440,&local_460,"> expression requires one or zero parameters.");
          reportError(context,&local_420,&local_440);
          std::__cxx11::string::~string((string *)&local_440);
          std::__cxx11::string::~string((string *)&local_460);
          std::__cxx11::string::~string((string *)&local_420);
        }
        std::__cxx11::string::string((string *)__return_storage_ptr__);
      }
      else {
        if (uVar2 == 0) {
          GetOriginalExpression_abi_cxx11_(&local_108,this);
          std::operator+(&local_148,"$<",identifier);
          std::operator+(&local_128,&local_148,"> expression requires no parameters.");
          reportError(context,&local_108,&local_128);
          std::__cxx11::string::~string((string *)&local_128);
          std::__cxx11::string::~string((string *)&local_148);
          std::__cxx11::string::~string((string *)&local_108);
        }
        else if (uVar2 == 1) {
          GetOriginalExpression_abi_cxx11_(&local_168,this);
          std::operator+(&local_1a8,"$<",identifier);
          std::operator+(&local_188,&local_1a8,"> expression requires exactly one parameter.");
          reportError(context,&local_168,&local_188);
          std::__cxx11::string::~string((string *)&local_188);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::__cxx11::string::~string((string *)&local_168);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
          std::operator+(&local_360,"$<",identifier);
          std::operator+(&local_340,&local_360,"> expression requires ");
          poVar7 = std::operator<<((ostream *)local_320,(string *)&local_340);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar2);
          poVar7 = std::operator<<(poVar7," comma separated parameters, but got ");
          sVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(parameters);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar6);
          std::operator<<(poVar7," instead.");
          std::__cxx11::string::~string((string *)&local_340);
          std::__cxx11::string::~string((string *)&local_360);
          GetOriginalExpression_abi_cxx11_(&local_380,this);
          std::__cxx11::ostringstream::str();
          reportError(context,&local_380,&local_3a0);
          std::__cxx11::string::~string((string *)&local_3a0);
          std::__cxx11::string::~string((string *)&local_380);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
        }
        std::__cxx11::string::string((string *)__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    if (((lastParam.field_2._M_local_buf[0xf] & 1U) != 0) && (lastParam.field_2._8_4_ == uVar2)) {
      ProcessArbitraryContent((string *)local_78,this,node,identifier,context,dagChecker,pend);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(parameters,(string *)local_78);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)local_78);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string((string *)&it);
    pvVar4 = __gnu_cxx::
             __normal_iterator<const_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_*,_std::vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>_>
             ::operator->(&pend);
    end = std::
          vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
          ::begin(pvVar4);
    pvVar4 = __gnu_cxx::
             __normal_iterator<const_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_*,_std::vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>_>
             ::operator->(&pend);
    local_c0._M_current =
         (cmGeneratorExpressionEvaluator **)
         std::
         vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
         ::end(pvVar4);
    while (bVar1 = __gnu_cxx::operator!=(&end,&local_c0), bVar1) {
      ppcVar5 = __gnu_cxx::
                __normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
                ::operator*(&end);
      (*(*ppcVar5)->_vptr_cmGeneratorExpressionEvaluator[3])(local_e0,*ppcVar5,context,dagChecker);
      std::__cxx11::string::operator+=((string *)&it,local_e0);
      std::__cxx11::string::~string(local_e0);
      if ((context->HadError & 1U) != 0) {
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        local_e4 = 1;
        goto LAB_00850f43;
      }
      __gnu_cxx::
      __normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
      ::operator++(&end);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(parameters,(value_type *)&it);
    local_e4 = 0;
LAB_00850f43:
    std::__cxx11::string::~string((string *)&it);
    if (local_e4 != 0) {
      return __return_storage_ptr__;
    }
    __gnu_cxx::
    __normal_iterator<const_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_*,_std::vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>_>
    ::operator++(&pend);
    lastParam.field_2._8_4_ = lastParam.field_2._8_4_ + 1;
  } while( true );
}

Assistant:

std::string GeneratorExpressionContent::EvaluateParameters(
  const cmGeneratorExpressionNode* node, const std::string& identifier,
  cmGeneratorExpressionContext* context,
  cmGeneratorExpressionDAGChecker* dagChecker,
  std::vector<std::string>& parameters) const
{
  const int numExpected = node->NumExpectedParameters();
  {
    std::vector<std::vector<cmGeneratorExpressionEvaluator*> >::const_iterator
      pit = this->ParamChildren.begin();
    const std::vector<
      std::vector<cmGeneratorExpressionEvaluator*> >::const_iterator pend =
      this->ParamChildren.end();
    const bool acceptsArbitraryContent =
      node->AcceptsArbitraryContentParameter();
    int counter = 1;
    for (; pit != pend; ++pit, ++counter) {
      if (acceptsArbitraryContent && counter == numExpected) {
        std::string lastParam = this->ProcessArbitraryContent(
          node, identifier, context, dagChecker, pit);
        parameters.push_back(lastParam);
        return std::string();
      }
      std::string parameter;
      std::vector<cmGeneratorExpressionEvaluator*>::const_iterator it =
        pit->begin();
      const std::vector<cmGeneratorExpressionEvaluator*>::const_iterator end =
        pit->end();
      for (; it != end; ++it) {
        parameter += (*it)->Evaluate(context, dagChecker);
        if (context->HadError) {
          return std::string();
        }
      }
      parameters.push_back(parameter);
    }
  }

  if ((numExpected > cmGeneratorExpressionNode::DynamicParameters &&
       (unsigned int)numExpected != parameters.size())) {
    if (numExpected == 0) {
      reportError(context, this->GetOriginalExpression(),
                  "$<" + identifier + "> expression requires no parameters.");
    } else if (numExpected == 1) {
      reportError(context, this->GetOriginalExpression(), "$<" + identifier +
                    "> expression requires "
                    "exactly one parameter.");
    } else {
      std::ostringstream e;
      e << "$<" + identifier + "> expression requires " << numExpected
        << " comma separated parameters, but got " << parameters.size()
        << " instead.";
      reportError(context, this->GetOriginalExpression(), e.str());
    }
    return std::string();
  }

  if (numExpected == cmGeneratorExpressionNode::OneOrMoreParameters &&
      parameters.empty()) {
    reportError(context, this->GetOriginalExpression(), "$<" + identifier +
                  "> expression requires at least one parameter.");
  }
  if (numExpected == cmGeneratorExpressionNode::OneOrZeroParameters &&
      parameters.size() > 1) {
    reportError(context, this->GetOriginalExpression(), "$<" + identifier +
                  "> expression requires one or zero parameters.");
  }
  return std::string();
}